

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O1

void __thiscall
slang::ast::Expression::visit<(anonymous_namespace)::HierarchicalVisitor&>
          (Expression *this,HierarchicalVisitor *visitor)

{
  IndexSetter *setter;
  StreamExpression *stream;
  
  (*(code *)(&DAT_00489b2c + *(int *)(&DAT_00489b2c + (ulong)this->kind * 4)))();
  return;
}

Assistant:

decltype(auto) Expression::visit(TVisitor&& visitor, Args&&... args) const {
    return visitExpression(this, visitor, std::forward<Args>(args)...);
}